

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

bool __thiscall
QHashPrivate::
iterator<QHashPrivate::Node<QGraphicsItem_*,_std::pair<QFlags<QEventPoint::State>,_QList<QEventPoint>_>_>_>
::isUnused(iterator<QHashPrivate::Node<QGraphicsItem_*,_std::pair<QFlags<QEventPoint::State>,_QList<QEventPoint>_>_>_>
           *this)

{
  return this->d->spans[this->bucket >> 7].offsets[(uint)this->bucket & 0x7f] == 0xff;
}

Assistant:

inline bool isUnused() const noexcept { return !d->spans[span()].hasNode(index()); }